

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDup(Gia_Man_t *p)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  int *piVar9;
  Gia_Obj_t *pGVar10;
  Abc_Cex_t *pAVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pName = pcVar8;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p_00->pSpec = pcVar8;
  if (p->pSibls != (int *)0x0) {
    piVar9 = (int *)calloc((long)p->nObjs,4);
    p_00->pSibls = piVar9;
  }
  p->pObjs->Value = 0;
  if (1 < p->nObjs) {
    lVar14 = 1;
    lVar15 = 0xc;
    do {
      pGVar2 = p->pObjs;
      uVar3 = *(ulong *)(&pGVar2->field_0x0 + lVar15);
      uVar6 = (uint)uVar3;
      uVar12 = uVar6 & 0x1fffffff;
      uVar13 = (uint)(uVar3 >> 0x20);
      if ((((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) ||
         ((uVar6 & 0x1fffffff) != (uVar13 & 0x1fffffff))) {
        if (uVar12 == 0x1fffffff || (int)uVar6 < 0) {
          if ((uVar6 & 0x9fffffff) == 0x9fffffff) {
            pGVar10 = Gia_ManAppendObj(p_00);
            uVar3 = *(ulong *)pGVar10;
            *(ulong *)pGVar10 = uVar3 | 0x9fffffff;
            *(ulong *)pGVar10 =
                 uVar3 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar4 = p_00->pObjs;
            if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) {
LAB_001d9a5d:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
            pGVar4 = p_00->pObjs;
            if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_001d9a5d;
            *(int *)((long)&pGVar2->Value + lVar15) =
                 (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
          }
          else if ((int)uVar6 < 0 && uVar12 != 0x1fffffff) {
            uVar12 = *(uint *)((long)pGVar2 + lVar15 + (ulong)(uVar12 << 2) * -3 + 8);
            if ((int)uVar12 < 0) goto LAB_001d9a3e;
            iVar5 = Gia_ManAppendCo(p_00,uVar12 ^ uVar6 >> 0x1d & 1);
            goto LAB_001d97c4;
          }
        }
        else {
          uVar6 = *(uint *)((long)pGVar2 + lVar15 + (ulong)(uVar12 << 2) * -3 + 8);
          if (((int)uVar6 < 0) ||
             (uVar12 = *(uint *)((long)pGVar2 +
                                lVar15 + (ulong)((uVar13 & 0x1fffffff) << 2) * -3 + 8),
             (int)uVar12 < 0)) goto LAB_001d9a3e;
          uVar6 = Gia_ManAppendAnd(p_00,uVar6 ^ (uint)(uVar3 >> 0x1d) & 1,
                                   uVar12 ^ uVar13 >> 0x1d & 1);
          *(uint *)((long)&pGVar2->Value + lVar15) = uVar6;
          pGVar4 = p->pObjs;
          if (((Gia_Obj_t *)(&pGVar2->field_0x0 + lVar15) < pGVar4) ||
             (pGVar4 + p->nObjs <= (Gia_Obj_t *)(&pGVar2->field_0x0 + lVar15))) goto LAB_001d9a5d;
          piVar9 = p->pSibls;
          if ((piVar9 != (int *)0x0) &&
             (iVar5 = (int)((long)pGVar2 + (lVar15 - (long)pGVar4) >> 2) * -0x55555555,
             piVar9[iVar5] != 0)) {
            iVar5 = piVar9[iVar5];
            if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) {
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (((int)pGVar4[iVar5].Value < 0) || ((int)uVar6 < 0)) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            p_00->pSibls[uVar6 >> 1] = pGVar4[iVar5].Value >> 1;
          }
        }
      }
      else {
        uVar12 = *(uint *)((long)pGVar2 + lVar15 + (ulong)(uVar12 << 2) * -3 + 8);
        if ((int)uVar12 < 0) {
LAB_001d9a3e:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar5 = Gia_ManAppendBuf(p_00,uVar12 ^ uVar6 >> 0x1d & 1);
LAB_001d97c4:
        *(int *)((long)&pGVar2->Value + lVar15) = iVar5;
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar14 < p->nObjs);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  if (p->pCexSeq != (Abc_Cex_t *)0x0) {
    pAVar11 = Abc_CexDup(p->pCexSeq,p->nRegs);
    p_00->pCexSeq = pAVar11;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDup( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsAnd(pObj) )
        {
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
                pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);  
        }
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    if ( p->pCexSeq )
        pNew->pCexSeq = Abc_CexDup( p->pCexSeq, Gia_ManRegNum(p) );
    return pNew;
}